

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_paths.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_2b80ee::ExchangePaths::ExchangePaths(ExchangePaths *this)

{
  shared_ptr<pstore::file::in_memory> *psVar1;
  ExchangePaths *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__ExchangePaths_003f42f0;
  in_memory_store::in_memory_store(&this->export_store_);
  psVar1 = in_memory_store::file(&this->export_store_);
  pstore::database::database<pstore::file::in_memory>(&this->export_db_,psVar1,true);
  in_memory_store::in_memory_store(&this->import_store_);
  psVar1 = in_memory_store::file(&this->import_store_);
  pstore::database::database<pstore::file::in_memory>(&this->import_db_,psVar1,true);
  pstore::database::set_vacuum_mode(&this->export_db_,disabled);
  pstore::database::set_vacuum_mode(&this->import_db_,disabled);
  return;
}

Assistant:

ExchangePaths ()
                : export_db_{export_store_.file ()}
                , import_db_{import_store_.file ()} {
            export_db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
            import_db_.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        }